

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O0

void __thiscall QDirIterator::QDirIterator(QDirIterator *this,QString *path,IteratorFlags flags)

{
  long lVar1;
  undefined4 in_EDX;
  QStringList *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff78;
  Filter in_stack_ffffffffffffff7c;
  unique_ptr<QDirIteratorPrivate,_std::default_delete<QDirIteratorPrivate>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x20);
  uVar2 = 0;
  QList<QString>::QList((QList<QString> *)0x2a18b7);
  QFlags<QDir::Filter>::QFlags
            ((QFlags<QDir::Filter> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  QDirIteratorPrivate::QDirIteratorPrivate
            ((QDirIteratorPrivate *)CONCAT44(in_stack_ffffffffffffffd4,in_EDX),in_RDI,in_RSI,
             (QFlagsStorageHelper<QDir::Filter,_4>)SUB84((ulong)uVar2 >> 0x20,0),
             (QFlagsStorageHelper<QDirIterator::IteratorFlag,_4>)SUB84(uVar2,0));
  std::unique_ptr<QDirIteratorPrivate,std::default_delete<QDirIteratorPrivate>>::
  unique_ptr<std::default_delete<QDirIteratorPrivate>,void>
            (in_stack_ffffffffffffff80,
             (pointer)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QList<QString>::~QList((QList<QString> *)0x2a190b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirIterator::QDirIterator(const QString &path, IteratorFlags flags)
    : d(new QDirIteratorPrivate(path, {}, QDir::NoFilter, flags))
{
}